

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::
~ExpressionStackWalker
          (ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_> *this)

{
  pointer ppEVar1;
  pointer pTVar2;
  
  ppEVar1 = (this->expressionStack).flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)(this->expressionStack).flexible.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar1
                   );
  }
  pTVar2 = (this->super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>).
           super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                                          ).
                                          super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pTVar2);
    return;
  }
  return;
}

Assistant:

ExpressionStackWalker() = default;